

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O3

void ConvexDecomposition::checkit(cbtHullTriangle *t)

{
  long lVar1;
  int iVar2;
  int a;
  int iVar3;
  long lVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  iVar2 = t->id;
  if ((-1 < (long)iVar2) && (iVar2 < DAT_00b6ffa0)) {
    if (*(cbtHullTriangle **)(tris + (long)iVar2 * 8) != t) {
      __assert_fail("tris[t->id]==t",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0x960,"void ConvexDecomposition::checkit(cbtHullTriangle *)");
    }
    lVar8 = -0x100000000;
    lVar4 = 0;
    while( true ) {
      if (lVar4 == 3) {
        return;
      }
      lVar1 = lVar4 + 1;
      lVar6 = lVar8 >> 0x20;
      lVar7 = 0;
      if (lVar1 != 3) {
        lVar7 = lVar1;
      }
      if (lVar1 == 1) {
        lVar6 = 2;
      }
      iVar2 = (&(t->super_int3).x)[lVar7];
      a = (&(t->super_int3).x)[lVar6];
      if (iVar2 == a) {
        __assert_fail("a!=b",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                      ,0x967,"void ConvexDecomposition::checkit(cbtHullTriangle *)");
      }
      iVar3 = (&(t->n).x)[lVar4];
      if (((long)iVar3 < 0) || (DAT_00b6ffa0 <= iVar3)) break;
      piVar5 = cbtHullTriangle::neib(*(cbtHullTriangle **)(tris + (long)iVar3 * 8),a,iVar2);
      lVar8 = lVar8 + 0x100000000;
      lVar4 = lVar1;
      if (*piVar5 != t->id) {
        __assert_fail("tris[t->n[i]]->neib(b,a) == t->id",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                      ,0x968,"void ConvexDecomposition::checkit(cbtHullTriangle *)");
      }
    }
  }
  __assert_fail("i>=0 && i<count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                ,0x577,
                "Type &ConvexDecomposition::Array<ConvexDecomposition::cbtHullTriangle *>::operator[](int) [Type = ConvexDecomposition::cbtHullTriangle *]"
               );
}

Assistant:

void checkit(cbtHullTriangle *t)
{
	int i;
	assert(tris[t->id]==t);
	for(i=0;i<3;i++)
	{
		int i1=(i+1)%3;
		int i2=(i+2)%3;
		int a = (*t)[i1];
		int b = (*t)[i2];
		assert(a!=b);
		assert( tris[t->n[i]]->neib(b,a) == t->id);
	}
}